

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.hpp
# Opt level: O0

void __thiscall ClipperLib::clipperException::~clipperException(clipperException *this)

{
  clipperException *this_local;
  
  *(undefined ***)this = &PTR__clipperException_010898a0;
  std::__cxx11::string::~string((string *)&this->m_descr);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

virtual ~clipperException() throw() {}